

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

WebPDecBuffer * GetOutputBuffer(WebPIDecoder *idec)

{
  if ((((idec != (WebPIDecoder *)0x0) && (idec->dec != (void *)0x0)) &&
      (STATE_VP8_PARTS0 < idec->state)) && (idec->final_output == (WebPDecBuffer *)0x0)) {
    return (idec->params).output;
  }
  return (WebPDecBuffer *)0x0;
}

Assistant:

static const WebPDecBuffer* GetOutputBuffer(const WebPIDecoder* const idec) {
  if (idec == NULL || idec->dec == NULL) {
    return NULL;
  }
  if (idec->state <= STATE_VP8_PARTS0) {
    return NULL;
  }
  if (idec->final_output != NULL) {
    return NULL;   // not yet slow-copied
  }
  return idec->params.output;
}